

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_347e::ProfileDataTest_StartStopEmpty_Test::TestBody
          (ProfileDataTest_StartStopEmpty_Test *this)

{
  Options *this_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_158;
  Message local_150;
  string local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110;
  string local_108;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_b8;
  Message local_b0 [3];
  string local_98;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  ProfileDataSlot PStack_58;
  Options options;
  ProfileDataSlot slots [8];
  int frequency;
  ProfileDataTest_StartStopEmpty_Test *this_local;
  
  PStack_58 = 0;
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  this_00 = (Options *)
            ((long)&gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  ProfileData::Options::Options(this_00);
  ProfileData::Options::set_frequency(this_00,1);
  (anonymous_namespace)::ProfileDataChecker::filename_abi_cxx11_
            (&local_98,&(this->super_ProfileDataTest).checker_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_71 = ProfileData::Start(&(this->super_ProfileDataTest).collector_,pcVar2,this_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_70,
               (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x177,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  ProfileData::Stop(&(this->super_ProfileDataTest).collector_);
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
            (&local_108,&(this->super_ProfileDataTest).checker_);
  testing::internal::EqHelper::
  Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e8,"kNoError","checker_.ValidateProfile()",
             (char (*) [1])&(anonymous_namespace)::kNoError,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  (anonymous_namespace)::ProfileDataChecker::Check_abi_cxx11_
            (&local_148,&(this->super_ProfileDataTest).checker_,&stack0xffffffffffffffa8,8);
  testing::internal::EqHelper::
  Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_128,"kNoError",
             "checker_.Check(slots, (sizeof(slots) / sizeof(*(slots))))",
             (char (*) [1])&(anonymous_namespace)::kNoError,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x17c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartStopEmpty) {
  const int frequency = 1;
  ProfileDataSlot slots[] = {
    0, 3, 0, 1000000 / frequency, 0,    // binary header
    0, 1, 0                             // binary trailer
  };

  ExpectStopped();
  ProfileData::Options options;
  options.set_frequency(frequency);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.Check(slots, arraysize(slots)));
}